

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O2

int OBJ_obj2nid(ASN1_OBJECT *o)

{
  int iVar1;
  ASN1_OBJECT *pAVar2;
  ushort *puVar3;
  
  iVar1 = 0;
  if ((o != (ASN1_OBJECT *)0x0) && (iVar1 = o->nid, iVar1 == 0)) {
    CRYPTO_MUTEX_lock_read(&global_added_lock);
    if ((global_added_by_data == (lhash_st_ASN1_OBJECT *)0x0) ||
       (pAVar2 = lh_ASN1_OBJECT_retrieve(global_added_by_data,(ASN1_OBJECT *)o),
       pAVar2 == (ASN1_OBJECT *)0x0)) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      puVar3 = (ushort *)bsearch(o,kNIDsInOIDOrder,0x371,2,obj_cmp);
      if (puVar3 == (ushort *)0x0) {
        return 0;
      }
      pAVar2 = get_builtin_object((uint)*puVar3);
    }
    else {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
    }
    iVar1 = pAVar2->nid;
  }
  return iVar1;
}

Assistant:

int OBJ_obj2nid(const ASN1_OBJECT *obj) {
  if (obj == NULL) {
    return NID_undef;
  }

  if (obj->nid != 0) {
    return obj->nid;
  }

  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_data != NULL) {
    ASN1_OBJECT *match;

    match = lh_ASN1_OBJECT_retrieve(global_added_by_data, obj);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match->nid;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

  const uint16_t *nid_ptr = reinterpret_cast<const uint16_t *>(
      bsearch(obj, kNIDsInOIDOrder, OPENSSL_ARRAY_SIZE(kNIDsInOIDOrder),
              sizeof(kNIDsInOIDOrder[0]), obj_cmp));
  if (nid_ptr == NULL) {
    return NID_undef;
  }

  return get_builtin_object(*nid_ptr)->nid;
}